

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_annotationbase.cpp
# Opt level: O0

void __thiscall
ON_Annotation::SetMaskBorder(ON_Annotation *this,ON_DimStyle *parent_style,double value)

{
  bool bCreateIfNull;
  ON_DimStyle *pOVar1;
  double candidate_value;
  ON_DimStyle *override_style;
  bool bCreate;
  double value_local;
  ON_DimStyle *parent_style_local;
  ON_Annotation *this_local;
  
  pOVar1 = ON_DimStyle::DimStyleOrDefault(parent_style);
  candidate_value = ON_DimStyle::MaskBorder(pOVar1);
  bCreateIfNull = Internal_DimStyleDoubleChanged(value,candidate_value);
  pOVar1 = Internal_GetOverrideStyle(this,bCreateIfNull);
  if (pOVar1 != (ON_DimStyle *)0x0) {
    ON_DimStyle::SetMaskBorder(pOVar1,value);
    ON_DimStyle::SetFieldOverride(pOVar1,MaskBorder,bCreateIfNull);
  }
  return;
}

Assistant:

void ON_Annotation::SetMaskBorder(const ON_DimStyle* parent_style, double value)
{
  parent_style = &ON_DimStyle::DimStyleOrDefault(parent_style);
  bool bCreate = Internal_DimStyleDoubleChanged(value, parent_style->MaskBorder());
  ON_DimStyle* override_style = Internal_GetOverrideStyle(bCreate);
  if (nullptr != override_style)
  {
    override_style->SetMaskBorder(value);
    override_style->SetFieldOverride(ON_DimStyle::field::MaskBorder, bCreate);
  }
}